

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

char * leveldb::DecodeEntry
                 (char *p,char *limit,uint32_t *shared,uint32_t *non_shared,uint32_t *value_length)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  
  if ((long)limit - (long)p < 3) {
    return (char *)0x0;
  }
  *shared = (uint)(byte)*p;
  *non_shared = (uint)(byte)p[1];
  bVar1 = p[2];
  uVar4 = (uint)bVar1;
  *value_length = (uint)bVar1;
  uVar2 = *non_shared;
  if ((*shared | uVar2 | (uint)bVar1) < 0x80) {
    pcVar5 = p + 3;
  }
  else {
    pcVar5 = GetVarint32Ptr(p,limit,shared);
    if (((pcVar5 == (char *)0x0) ||
        (pcVar5 = GetVarint32Ptr(pcVar5,limit,non_shared), pcVar5 == (char *)0x0)) ||
       (pcVar5 = GetVarint32Ptr(pcVar5,limit,value_length), pcVar5 == (char *)0x0)) {
      return (char *)0x0;
    }
    uVar2 = *non_shared;
    uVar4 = *value_length;
  }
  pcVar3 = (char *)0x0;
  if (uVar4 + uVar2 <= (uint)((int)limit - (int)pcVar5)) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
}

Assistant:

static inline const char* DecodeEntry(const char* p, const char* limit,
                                      uint32_t* shared, uint32_t* non_shared,
                                      uint32_t* value_length) {
  if (limit - p < 3) return nullptr;
  *shared = reinterpret_cast<const uint8_t*>(p)[0];
  *non_shared = reinterpret_cast<const uint8_t*>(p)[1];
  *value_length = reinterpret_cast<const uint8_t*>(p)[2];
  if ((*shared | *non_shared | *value_length) < 128) {
    // Fast path: all three values are encoded in one byte each
    p += 3;
  } else {
    if ((p = GetVarint32Ptr(p, limit, shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, non_shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, value_length)) == nullptr) return nullptr;
  }

  if (static_cast<uint32_t>(limit - p) < (*non_shared + *value_length)) {
    return nullptr;
  }
  return p;
}